

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteStates.cpp
# Opt level: O0

string * __thiscall
MADPComponentDiscreteStates::SoftPrintInitialStateDistribution_abi_cxx11_
          (MADPComponentDiscreteStates *this)

{
  ostream *poVar1;
  E *this_00;
  stringstream *arg;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  if ((*(byte *)(in_RSI + 8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    poVar1 = std::operator<<(local_188,"MADPComponentDiscreteStates::PrintInitialStateDistribution("
                            );
    this_00 = (E *)std::operator<<(poVar1,") - Error: not initialized. ");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    arg = (stringstream *)__cxa_allocate_exception(0x28);
    E::E(this_00,arg);
    __cxa_throw(arg,&E::typeinfo,E::~E);
  }
  (**(code **)(**(long **)(in_RSI + 0x30) + 0x30))(in_RDI);
  return in_RDI;
}

Assistant:

string MADPComponentDiscreteStates::SoftPrintInitialStateDistribution() const
{
    if(!_m_initialized)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteStates::PrintInitialStateDistribution("<< 
        ") - Error: not initialized. " <<endl;
        throw E(ss);
    }
    return(_m_initialStateDistribution->SoftPrint());
}